

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

int calc_maplen(int handle)

{
  int len;
  int i;
  int handle_local;
  int local_4;
  
  if (GA[handle].mapc == (C_Integer *)0x0) {
    local_4 = 0;
  }
  else {
    len = 0;
    if (GA[handle].distr_type == 4) {
      for (i = 0; i < GA[handle].ndim; i = i + 1) {
        len = len + (int)GA[handle].num_blocks[i];
      }
    }
    else {
      for (i = 0; i < GA[handle].ndim; i = i + 1) {
        len = GA[handle].nblock[i] + len;
      }
    }
    local_4 = len;
  }
  return local_4;
}

Assistant:

static int calc_maplen(int handle)
{
    if (GA[handle].mapc != NULL) {
        int i,len=0;
        if (GA[handle].distr_type != TILED_IRREG) {
          for (i=0; i<GA[handle].ndim; i++) {
            len += GA[handle].nblock[i];
          }
        } else {
          for (i=0; i<GA[handle].ndim; i++) {
            len += GA[handle].num_blocks[i];
          }
        }
        return len;
    }
    return 0;
}